

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

Program __thiscall Inlining::run(Inlining *this,Program *program)

{
  Type *pTVar1;
  Function *pFVar2;
  mapped_type *pmVar3;
  Function *extraout_RDX;
  Program PVar4;
  Function *main_function;
  FunctionTable function_table;
  Analyze analyze;
  Function *local_60;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Inlining::FunctionTableEntry>,_std::_Select1st<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  local_58;
  Analyze local_28;
  
  local_60 = program->first;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28.super_Visitor<void>._vptr_Visitor = (_func_int **)&PTR_visit_int_literal_00154750;
  local_28.function_table = (FunctionTable *)&local_58;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  local_28.function = local_60;
  Analyze::evaluate(&local_28,&local_60->block);
  pFVar2 = (Function *)operator_new(0x60);
  pTVar1 = local_60->return_type;
  (pFVar2->path)._M_dataplus._M_p = (pointer)&(pFVar2->path).field_2;
  (pFVar2->path)._M_string_length = 0;
  (pFVar2->path).field_2._M_local_buf[0] = '\0';
  (pFVar2->block).first = (Expression *)0x0;
  (pFVar2->block).last = (Expression *)0x0;
  pFVar2->arguments = 0;
  (pFVar2->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar2->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar2->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar2->return_type = pTVar1;
  pFVar2->next_function = (Function *)0x0;
  if (*(long *)this == 0) {
    *(Function **)this = pFVar2;
  }
  if (*(long *)(this + 8) != 0) {
    *(Function **)(*(long *)(this + 8) + 0x58) = pFVar2;
  }
  *(Function **)(this + 8) = pFVar2;
  pmVar3 = std::
           map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
           ::operator[]((map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
                         *)&local_58,&local_60);
  pmVar3->new_function = pFVar2;
  Replace::evaluate((Program *)this,(FunctionTable *)&local_58,local_60,&pFVar2->block,
                    &local_60->block);
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Inlining::FunctionTableEntry>,_std::_Select1st<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  ::~_Rb_tree(&local_58);
  PVar4.last = extraout_RDX;
  PVar4.first = (Function *)this;
  return PVar4;
}

Assistant:

static Program run(const Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FunctionTable function_table;
		Analyze analyze(function_table, main_function);
		analyze.evaluate(main_function->get_block());
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[main_function].new_function = new_function;
		Replace::evaluate(&new_program, function_table, main_function, new_function->get_block(), main_function->get_block());
		return new_program;
	}